

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O1

int LoadBuildProduct(TCascStorage *hs,char *param_2,char *szDataBegin,char *szDataEnd,void *param_5)

{
  size_t __n;
  int iVar1;
  char *__s2;
  long lVar2;
  bool bVar3;
  
  __s2 = "Hero";
  lVar2 = 0x18;
  bVar3 = false;
  do {
    __n = *(size_t *)((long)&LocaleStrings[0xf].szLocale + lVar2);
    if ((long)szDataEnd - (long)szDataBegin == __n) {
      iVar1 = strncasecmp(szDataBegin,__s2,__n);
      if (iVar1 == 0) {
        hs->dwGameInfo = *(DWORD *)((long)&LocaleStrings[0xf].dwLocale + lVar2);
        if (!bVar3) {
          return 0;
        }
        break;
      }
    }
    __s2 = *(char **)((long)&GameIds[0].szGameInfo + lVar2);
    bVar3 = __s2 == (char *)0x0;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0xc0);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascFiles.cpp"
                ,0x1d4,
                "int LoadBuildProduct(TCascStorage *, const char *, const char *, const char *, void *)"
               );
}

Assistant:

static int LoadBuildProduct(TCascStorage * hs, const char * /* szVariableName */, const char * szDataBegin, const char * szDataEnd, void * /* pvParam */)
{
    // Go through all games that we support
    for(size_t i = 0; GameIds[i].szGameInfo != NULL; i++)
    {
        // Check the length of the variable
        if((size_t)(szDataEnd - szDataBegin) == GameIds[i].cchGameInfo)
        {
            // Check the string
            if(!_strnicmp(szDataBegin, GameIds[i].szGameInfo, GameIds[i].cchGameInfo))
            {
                hs->dwGameInfo = GameIds[i].dwGameInfo;
                return ERROR_SUCCESS;
            }
        }
    }

    // Unknown/unsupported game
    assert(false);
    return ERROR_BAD_FORMAT;
}